

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

int __thiscall GrcFont::ReadData(GrcFont *this,byte **ppData,ptrdiff_t lnOffset,size_t lnSize)

{
  int iVar1;
  byte *pbVar2;
  size_t sVar3;
  string *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  pbVar2 = (byte *)operator_new__(lnSize);
  *ppData = pbVar2;
  iVar1 = fseek((FILE *)this->m_pFile,lnOffset,0);
  if (iVar1 == 0) {
    sVar3 = fread(*ppData,lnSize,1,(FILE *)this->m_pFile);
    if (sVar3 == 1) {
      return 1;
    }
    std::__cxx11::string::string
              ((string *)&local_60,"Could not read requested data from font file",&local_61);
    GrcErrorList::AddError(&g_errorList,0x7f,(GdlObject *)0x0,&local_60);
    this_00 = &local_60;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_40,"Could not seek to correct place in font file",&local_61);
    GrcErrorList::AddError(&g_errorList,0x7e,(GdlObject *)0x0,&local_40);
    this_00 = &local_40;
  }
  std::__cxx11::string::~string((string *)this_00);
  return 0;
}

Assistant:

int GrcFont::ReadData(gr::byte ** ppData, ptrdiff_t lnOffset, size_t lnSize)
{
	*ppData = new gr::byte[lnSize];
	if (!*ppData)
	{
		g_errorList.AddError(125, NULL, 
			"Memory failure: could not allocate ppData array while reading font file");
		return false;
	}
	if (fseek(m_pFile, long(lnOffset), SEEK_SET))
	{
		g_errorList.AddError(126, NULL, 
			"Could not seek to correct place in font file");
		return false;
	}
	if (fread(*ppData, lnSize, 1, m_pFile) != 1)
	{
		g_errorList.AddError(127, NULL, 
			"Could not read requested data from font file");
		return false;
	}
	return true;
}